

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

double SoapySDRDevice_getReferenceClockRate(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  double dVar2;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  dVar2 = (double)(**(code **)(*(long *)device + 600))(device);
  return dVar2;
}

Assistant:

double SoapySDRDevice_getReferenceClockRate(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getReferenceClockRate();
    __SOAPY_SDR_C_CATCH_RET(NAN);
}